

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumDescriptor::GetLocationPath
          (EnumDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  int *piVar1;
  long lVar2;
  long *plVar3;
  iterator iVar4;
  int local_1c;
  
  if (*(Descriptor **)(this + 0x18) == (Descriptor *)0x0) {
    local_1c = 5;
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar4._M_current == piVar1) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_1c);
      lVar2 = *(long *)(this + 0x18);
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 5;
      iVar4._M_current = iVar4._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current;
      lVar2 = 0;
    }
    plVar3 = (long *)(*(long *)(this + 0x10) + 0x70);
    if (lVar2 != 0) {
      plVar3 = (long *)(lVar2 + 0x40);
    }
    lVar2 = *plVar3;
  }
  else {
    Descriptor::GetLocationPath(*(Descriptor **)(this + 0x18),output);
    local_1c = 4;
    iVar4._M_current =
         (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
         _M_finish;
    piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_end_of_storage;
    if (iVar4._M_current == piVar1) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_1c);
      iVar4._M_current =
           (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      piVar1 = (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    }
    else {
      *iVar4._M_current = 4;
      iVar4._M_current = iVar4._M_current + 1;
      (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar4._M_current;
    }
    plVar3 = (long *)(*(long *)(this + 0x10) + 0x70);
    if (*(long *)(this + 0x18) != 0) {
      plVar3 = (long *)(*(long *)(this + 0x18) + 0x40);
    }
    lVar2 = *plVar3;
  }
  local_1c = (int)((ulong)((long)this - lVar2) >> 4) * -0x33333333;
  if (iVar4._M_current == piVar1) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(output,iVar4,&local_1c);
  }
  else {
    *iVar4._M_current = local_1c;
    (output->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar4._M_current + 1;
  }
  return;
}

Assistant:

void EnumDescriptor::GetLocationPath(std::vector<int>* output) const {
  if (containing_type()) {
    containing_type()->GetLocationPath(output);
    output->push_back(DescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  } else {
    output->push_back(FileDescriptorProto::kEnumTypeFieldNumber);
    output->push_back(index());
  }
}